

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayoutItem::realSizeHint(QToolBarAreaLayoutItem *this)

{
  Policy PVar1;
  QSize *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *wid;
  QSize s;
  int in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_28;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_24;
  undefined8 local_20;
  undefined8 local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSize *)(**(code **)(**(long **)in_RDI + 0x68))();
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (**(code **)((long)*this_00 + 0x70))();
  local_20 = (**(code **)((long)*this_00 + 0x78))();
  local_10 = QSize::expandedTo(this_00,(QSize *)in_stack_ffffffffffffffa0);
  local_24.bits = (Bits)QWidget::sizePolicy(in_stack_ffffffffffffffa0);
  PVar1 = QSizePolicy::horizontalPolicy((QSizePolicy *)&local_24.bits);
  if (PVar1 == Ignored) {
    QSize::setWidth((QSize *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  local_28.bits = (Bits)QWidget::sizePolicy(in_stack_ffffffffffffffa0);
  PVar1 = QSizePolicy::verticalPolicy((QSizePolicy *)&local_28.bits);
  if (PVar1 == Ignored) {
    QSize::setHeight((QSize *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  QWidget::maximumSize(in_RDI);
  QSize::boundedTo(this_00,(QSize *)in_stack_ffffffffffffffa0);
  QWidget::minimumSize(in_RDI);
  local_10 = QSize::expandedTo(this_00,(QSize *)in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarAreaLayoutItem::realSizeHint() const
{
    QWidget *wid = widgetItem->widget();
    QSize s = wid->sizeHint().expandedTo(wid->minimumSizeHint());
    if (wid->sizePolicy().horizontalPolicy() == QSizePolicy::Ignored)
        s.setWidth(0);
    if (wid->sizePolicy().verticalPolicy() == QSizePolicy::Ignored)
        s.setHeight(0);
    s = s.boundedTo(wid->maximumSize())
        .expandedTo(wid->minimumSize());
    return s;
}